

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int dprintf_Pass1(char *format,va_stack *vto,char **endpos,__va_list_tag *arglist)

{
  uint uVar1;
  _Bool _Var2;
  long lVar3;
  char *pcVar4;
  char *__nptr;
  undefined8 *local_1a8;
  int *local_188;
  uint *local_170;
  undefined8 *local_158;
  undefined8 *local_140;
  undefined8 *local_128;
  undefined8 *local_110;
  undefined8 *local_f8;
  undefined8 *local_e0;
  int *local_c0;
  int *local_a8;
  long k_1;
  long k;
  long i;
  long max_param;
  char *pcStack_58;
  int flags;
  long precision;
  long width;
  long this_param;
  char *pcStack_38;
  int param_num;
  char *fmt;
  __va_list_tag *arglist_local;
  char **endpos_local;
  va_stack *vto_local;
  char *format_local;
  
  this_param._4_4_ = 0;
  i = 0;
  pcVar4 = format;
  fmt = (char *)arglist;
  arglist_local = (__va_list_tag *)endpos;
  endpos_local = (char **)vto;
  vto_local = (va_stack *)format;
  do {
    while( true ) {
      do {
        pcStack_38 = pcVar4;
        if (*pcStack_38 == '\0') {
          for (k = 0; k < i; k = k + 1) {
            if ((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x4000) != 0) {
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_a8 = (int *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_a8 = *(int **)(fmt + 8);
                *(int **)(fmt + 8) = local_a8 + 2;
              }
              endpos_local[(long)endpos_local[k * 4 + 1] * 4 + 3] = (char *)(long)*local_a8;
            }
            if ((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x10000) != 0) {
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_c0 = (int *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_c0 = *(int **)(fmt + 8);
                *(int **)(fmt + 8) = local_c0 + 2;
              }
              endpos_local[(long)endpos_local[k * 4 + 2] * 4 + 3] = (char *)(long)*local_c0;
            }
            switch(*(undefined4 *)(endpos_local + k * 4)) {
            case 0:
            case 2:
            case 4:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_f8 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_f8 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_f8 + 1;
              }
              endpos_local[k * 4 + 3] = (char *)*local_f8;
              break;
            case 1:
              uVar1 = *(uint *)fmt;
              if (uVar1 < 0x29) {
                local_e0 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)fmt = uVar1 + 8;
              }
              else {
                local_e0 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_e0 + 1;
              }
              endpos_local[k * 4 + 3] = (char *)*local_e0;
              break;
            case 3:
              if (((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x40) == 0) ||
                 ((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x200) == 0)) {
                if ((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x40) == 0) {
                  if (((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x20) == 0) ||
                     ((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x200) == 0)) {
                    if ((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x20) == 0) {
                      if ((*(uint *)((long)endpos_local + k * 0x20 + 4) & 0x200) == 0) {
                        uVar1 = *(uint *)fmt;
                        if (uVar1 < 0x29) {
                          local_188 = (int *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                          *(uint *)fmt = uVar1 + 8;
                        }
                        else {
                          local_188 = *(int **)(fmt + 8);
                          *(int **)(fmt + 8) = local_188 + 2;
                        }
                        endpos_local[k * 4 + 3] = (char *)(long)*local_188;
                      }
                      else {
                        uVar1 = *(uint *)fmt;
                        if (uVar1 < 0x29) {
                          local_170 = (uint *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                          *(uint *)fmt = uVar1 + 8;
                        }
                        else {
                          local_170 = *(uint **)(fmt + 8);
                          *(uint **)(fmt + 8) = local_170 + 2;
                        }
                        endpos_local[k * 4 + 3] = (char *)(ulong)*local_170;
                      }
                    }
                    else {
                      uVar1 = *(uint *)fmt;
                      if (uVar1 < 0x29) {
                        local_158 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                        *(uint *)fmt = uVar1 + 8;
                      }
                      else {
                        local_158 = *(undefined8 **)(fmt + 8);
                        *(undefined8 **)(fmt + 8) = local_158 + 1;
                      }
                      endpos_local[k * 4 + 3] = (char *)*local_158;
                    }
                  }
                  else {
                    uVar1 = *(uint *)fmt;
                    if (uVar1 < 0x29) {
                      local_140 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                      *(uint *)fmt = uVar1 + 8;
                    }
                    else {
                      local_140 = *(undefined8 **)(fmt + 8);
                      *(undefined8 **)(fmt + 8) = local_140 + 1;
                    }
                    endpos_local[k * 4 + 3] = (char *)*local_140;
                  }
                }
                else {
                  uVar1 = *(uint *)fmt;
                  if (uVar1 < 0x29) {
                    local_128 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                    *(uint *)fmt = uVar1 + 8;
                  }
                  else {
                    local_128 = *(undefined8 **)(fmt + 8);
                    *(undefined8 **)(fmt + 8) = local_128 + 1;
                  }
                  endpos_local[k * 4 + 3] = (char *)*local_128;
                }
              }
              else {
                uVar1 = *(uint *)fmt;
                if (uVar1 < 0x29) {
                  local_110 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                  *(uint *)fmt = uVar1 + 8;
                }
                else {
                  local_110 = *(undefined8 **)(fmt + 8);
                  *(undefined8 **)(fmt + 8) = local_110 + 1;
                }
                endpos_local[k * 4 + 3] = (char *)*local_110;
              }
              break;
            default:
              break;
            case 7:
              uVar1 = *(uint *)(fmt + 4);
              if (uVar1 < 0xa1) {
                local_1a8 = (undefined8 *)((long)(int)uVar1 + *(long *)(fmt + 0x10));
                *(uint *)(fmt + 4) = uVar1 + 0x10;
              }
              else {
                local_1a8 = *(undefined8 **)(fmt + 8);
                *(undefined8 **)(fmt + 8) = local_1a8 + 1;
              }
              endpos_local[k * 4 + 3] = (char *)*local_1a8;
              break;
            case 9:
              *(undefined4 *)(endpos_local + k * 4) = 3;
            }
          }
          return 0;
        }
        pcVar4 = pcStack_38 + 1;
      } while (*pcStack_38 != '%');
      if (*pcVar4 != '%') break;
      pcVar4 = pcStack_38 + 2;
    }
    max_param._4_4_ = 0;
    this_param._4_4_ = this_param._4_4_ + 1;
    pcStack_38 = pcVar4;
    width = dprintf_DollarString(pcVar4,&stack0xffffffffffffffc8);
    if (width == 0) {
      width = (long)this_param._4_4_;
    }
    if (i < width) {
      i = width;
    }
    precision = 0;
    pcStack_58 = (char *)0x0;
    while (_Var2 = dprintf_IsQualifierNoDollar(pcStack_38), pcVar4 = pcStack_38, _Var2) {
      __nptr = pcStack_38 + 1;
      switch(*pcStack_38) {
      case '\0':
        __nptr = pcStack_38;
      default:
        pcStack_38 = __nptr;
        break;
      case ' ':
        max_param._4_4_ = max_param._4_4_ | 1;
        pcStack_38 = __nptr;
        break;
      case '#':
        max_param._4_4_ = max_param._4_4_ | 8;
        pcStack_38 = __nptr;
        break;
      case '*':
        max_param._4_4_ = max_param._4_4_ | 0x4000;
        this_param._4_4_ = this_param._4_4_ + 1;
        pcStack_38 = __nptr;
        precision = dprintf_DollarString(__nptr,&stack0xffffffffffffffc8);
        if (precision == 0) {
          precision = (long)this_param._4_4_;
        }
        if (i < precision) {
          i = precision;
        }
        break;
      case '+':
        max_param._4_4_ = max_param._4_4_ | 2;
        pcStack_38 = __nptr;
        break;
      case '-':
        max_param._4_4_ = max_param._4_4_ & 0xfffffeff | 4;
        pcStack_38 = __nptr;
        break;
      case '.':
        if (*__nptr == '*') {
          max_param._4_4_ = max_param._4_4_ | 0x10000;
          pcStack_38 = pcStack_38 + 2;
          this_param._4_4_ = this_param._4_4_ + 1;
          pcStack_58 = (char *)dprintf_DollarString(pcStack_38,&stack0xffffffffffffffc8);
          if (pcStack_58 == (char *)0x0) {
            pcStack_58 = (char *)(long)this_param._4_4_;
          }
          if (i < (long)pcStack_58) {
            i = (long)pcStack_58;
          }
        }
        else {
          max_param._4_4_ = max_param._4_4_ | 0x8000;
          pcStack_38 = __nptr;
          pcStack_58 = (char *)strtol(__nptr,&stack0xffffffffffffffc8,10);
        }
        if ((max_param._4_4_ & 0x18000) == 0x18000) {
          return 1;
        }
        break;
      case '0':
        if ((max_param._4_4_ & 4) == 0) {
          max_param._4_4_ = max_param._4_4_ | 0x100;
        }
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        max_param._4_4_ = max_param._4_4_ | 0x2000;
        pcStack_38 = __nptr;
        precision = strtol(pcVar4,&stack0xffffffffffffffc8,10);
        break;
      case 'L':
        max_param._4_4_ = max_param._4_4_ | 0x80;
        pcStack_38 = __nptr;
        break;
      case 'O':
        max_param._4_4_ = max_param._4_4_ | 0x20;
        pcStack_38 = __nptr;
        break;
      case 'h':
        max_param._4_4_ = max_param._4_4_ | 0x10;
        pcStack_38 = __nptr;
        break;
      case 'l':
        if ((max_param._4_4_ & 0x20) == 0) {
          max_param._4_4_ = max_param._4_4_ | 0x20;
          pcStack_38 = __nptr;
        }
        else {
          max_param._4_4_ = max_param._4_4_ | 0x40;
          pcStack_38 = __nptr;
        }
        break;
      case 'q':
        max_param._4_4_ = max_param._4_4_ | 0x40;
        pcStack_38 = __nptr;
        break;
      case 'z':
        max_param._4_4_ = max_param._4_4_ | 0x20;
        pcStack_38 = __nptr;
      }
    }
    lVar3 = width + -1;
    if ((lVar3 < 0) || (0x7f < lVar3)) {
      return 1;
    }
    switch(*pcStack_38) {
    case 'E':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 7;
      max_param._4_4_ = max_param._4_4_ | 0x41000;
      break;
    default:
      *(undefined4 *)(endpos_local + lVar3 * 4) = 0;
      break;
    case 'G':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 7;
      max_param._4_4_ = max_param._4_4_ | 0x81000;
      break;
    case 'S':
      max_param._4_4_ = max_param._4_4_ | 8;
    case 's':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 1;
      break;
    case 'X':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 3;
      max_param._4_4_ = max_param._4_4_ | 0x1a00;
      break;
    case 'c':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 3;
      max_param._4_4_ = max_param._4_4_ | 0x20000;
      break;
    case 'd':
    case 'i':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 3;
      break;
    case 'e':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 7;
      max_param._4_4_ = max_param._4_4_ | 0x40000;
      break;
    case 'f':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 7;
      break;
    case 'g':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 7;
      max_param._4_4_ = max_param._4_4_ | 0x80000;
      break;
    case 'n':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 4;
      break;
    case 'o':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 3;
      max_param._4_4_ = max_param._4_4_ | 0x400;
      break;
    case 'p':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 2;
      break;
    case 'u':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 3;
      max_param._4_4_ = max_param._4_4_ | 0x200;
      break;
    case 'x':
      *(undefined4 *)(endpos_local + lVar3 * 4) = 3;
      max_param._4_4_ = max_param._4_4_ | 0xa00;
    }
    *(uint *)((long)endpos_local + lVar3 * 0x20 + 4) = max_param._4_4_;
    endpos_local[lVar3 * 4 + 1] = (char *)precision;
    endpos_local[lVar3 * 4 + 2] = pcStack_58;
    if ((max_param._4_4_ & 0x4000) != 0) {
      pcVar4 = (char *)(precision + -1);
      if (((long)pcVar4 < 0) || (0x7f < (long)pcVar4)) {
        return 1;
      }
      endpos_local[lVar3 * 4 + 1] = pcVar4;
      *(undefined4 *)(endpos_local + (long)pcVar4 * 4) = 9;
      *(undefined4 *)((long)endpos_local + (long)pcVar4 * 0x20 + 4) = 0;
      endpos_local[(long)pcVar4 * 4 + 1] = (char *)0x0;
      endpos_local[(long)pcVar4 * 4 + 2] = (char *)0x0;
    }
    if ((max_param._4_4_ & 0x10000) != 0) {
      pcStack_58 = pcStack_58 + -1;
      if (((long)pcStack_58 < 0) || (0x7f < (long)pcStack_58)) {
        return 1;
      }
      endpos_local[lVar3 * 4 + 2] = pcStack_58;
      *(undefined4 *)(endpos_local + (long)pcStack_58 * 4) = 9;
      *(undefined4 *)((long)endpos_local + (long)pcStack_58 * 0x20 + 4) = 0;
      endpos_local[(long)pcStack_58 * 4 + 1] = (char *)0x0;
      endpos_local[(long)pcStack_58 * 4 + 2] = (char *)0x0;
    }
    *(char **)arglist_local = pcStack_38 + (int)(uint)(*pcStack_38 != '\0');
    pcVar4 = pcStack_38;
    arglist_local = (__va_list_tag *)&arglist_local->overflow_arg_area;
  } while( true );
}

Assistant:

static int dprintf_Pass1(const char *format, struct va_stack *vto,
                         char **endpos, va_list arglist)
{
  char *fmt = (char *)format;
  int param_num = 0;
  long this_param;
  long width;
  long precision;
  int flags;
  long max_param = 0;
  long i;

  while(*fmt) {
    if(*fmt++ == '%') {
      if(*fmt == '%') {
        fmt++;
        continue; /* while */
      }

      flags = FLAGS_NEW;

      /* Handle the positional case (N$) */

      param_num++;

      this_param = dprintf_DollarString(fmt, &fmt);
      if(0 == this_param)
        /* we got no positional, get the next counter */
        this_param = param_num;

      if(this_param > max_param)
        max_param = this_param;

      /*
       * The parameter with number 'i' should be used. Next, we need
       * to get SIZE and TYPE of the parameter. Add the information
       * to our array.
       */

      width = 0;
      precision = 0;

      /* Handle the flags */

      while(dprintf_IsQualifierNoDollar(fmt)) {
#if defined(MP_HAVE_INT_EXTENSIONS)
        if(!strncmp(fmt, "I32", 3)) {
          flags |= FLAGS_LONG;
          fmt += 3;
        }
        else if(!strncmp(fmt, "I64", 3)) {
          flags |= FLAGS_LONGLONG;
          fmt += 3;
        }
        else
#endif

        switch(*fmt++) {
        case ' ':
          flags |= FLAGS_SPACE;
          break;
        case '+':
          flags |= FLAGS_SHOWSIGN;
          break;
        case '-':
          flags |= FLAGS_LEFT;
          flags &= ~FLAGS_PAD_NIL;
          break;
        case '#':
          flags |= FLAGS_ALT;
          break;
        case '.':
          if('*' == *fmt) {
            /* The precision is picked from a specified parameter */

            flags |= FLAGS_PRECPARAM;
            fmt++;
            param_num++;

            i = dprintf_DollarString(fmt, &fmt);
            if(i)
              precision = i;
            else
              precision = param_num;

            if(precision > max_param)
              max_param = precision;
          }
          else {
            flags |= FLAGS_PREC;
            precision = strtol(fmt, &fmt, 10);
          }
          if((flags & (FLAGS_PREC | FLAGS_PRECPARAM)) ==
             (FLAGS_PREC | FLAGS_PRECPARAM))
            /* it is not permitted to use both kinds of precision for the same
               argument */
            return 1;
          break;
        case 'h':
          flags |= FLAGS_SHORT;
          break;
#if defined(MP_HAVE_INT_EXTENSIONS)
        case 'I':
#if (SIZEOF_CURL_OFF_T > SIZEOF_LONG)
          flags |= FLAGS_LONGLONG;
#else
          flags |= FLAGS_LONG;
#endif
          break;
#endif
        case 'l':
          if(flags & FLAGS_LONG)
            flags |= FLAGS_LONGLONG;
          else
            flags |= FLAGS_LONG;
          break;
        case 'L':
          flags |= FLAGS_LONGDOUBLE;
          break;
        case 'q':
          flags |= FLAGS_LONGLONG;
          break;
        case 'z':
          /* the code below generates a warning if -Wunreachable-code is
             used */
#if (SIZEOF_SIZE_T > SIZEOF_LONG)
          flags |= FLAGS_LONGLONG;
#else
          flags |= FLAGS_LONG;
#endif
          break;
        case 'O':
#if (SIZEOF_CURL_OFF_T > SIZEOF_LONG)
          flags |= FLAGS_LONGLONG;
#else
          flags |= FLAGS_LONG;
#endif
          break;
        case '0':
          if(!(flags & FLAGS_LEFT))
            flags |= FLAGS_PAD_NIL;
          /* FALLTHROUGH */
        case '1': case '2': case '3': case '4':
        case '5': case '6': case '7': case '8': case '9':
          flags |= FLAGS_WIDTH;
          width = strtol(fmt-1, &fmt, 10);
          break;
        case '*':  /* Special case */
          flags |= FLAGS_WIDTHPARAM;
          param_num++;

          i = dprintf_DollarString(fmt, &fmt);
          if(i)
            width = i;
          else
            width = param_num;
          if(width > max_param)
            max_param = width;
          break;
        case '\0':
          fmt--;
        default:
          break;
        }
      } /* switch */

      /* Handle the specifier */

      i = this_param - 1;

      if((i < 0) || (i >= MAX_PARAMETERS))
        /* out of allowed range */
        return 1;

      switch (*fmt) {
      case 'S':
        flags |= FLAGS_ALT;
        /* FALLTHROUGH */
      case 's':
        vto[i].type = FORMAT_STRING;
        break;
      case 'n':
        vto[i].type = FORMAT_INTPTR;
        break;
      case 'p':
        vto[i].type = FORMAT_PTR;
        break;
      case 'd': case 'i':
        vto[i].type = FORMAT_INT;
        break;
      case 'u':
        vto[i].type = FORMAT_INT;
        flags |= FLAGS_UNSIGNED;
        break;
      case 'o':
        vto[i].type = FORMAT_INT;
        flags |= FLAGS_OCTAL;
        break;
      case 'x':
        vto[i].type = FORMAT_INT;
        flags |= FLAGS_HEX|FLAGS_UNSIGNED;
        break;
      case 'X':
        vto[i].type = FORMAT_INT;
        flags |= FLAGS_HEX|FLAGS_UPPER|FLAGS_UNSIGNED;
        break;
      case 'c':
        vto[i].type = FORMAT_INT;
        flags |= FLAGS_CHAR;
        break;
      case 'f':
        vto[i].type = FORMAT_DOUBLE;
        break;
      case 'e':
        vto[i].type = FORMAT_DOUBLE;
        flags |= FLAGS_FLOATE;
        break;
      case 'E':
        vto[i].type = FORMAT_DOUBLE;
        flags |= FLAGS_FLOATE|FLAGS_UPPER;
        break;
      case 'g':
        vto[i].type = FORMAT_DOUBLE;
        flags |= FLAGS_FLOATG;
        break;
      case 'G':
        vto[i].type = FORMAT_DOUBLE;
        flags |= FLAGS_FLOATG|FLAGS_UPPER;
        break;
      default:
        vto[i].type = FORMAT_UNKNOWN;
        break;
      } /* switch */

      vto[i].flags = flags;
      vto[i].width = width;
      vto[i].precision = precision;

      if(flags & FLAGS_WIDTHPARAM) {
        /* we have the width specified from a parameter, so we make that
           parameter's info setup properly */
        long k = width - 1;
        if((k < 0) || (k >= MAX_PARAMETERS))
          /* out of allowed range */
          return 1;
        vto[i].width = k;
        vto[k].type = FORMAT_WIDTH;
        vto[k].flags = FLAGS_NEW;
        /* can't use width or precision of width! */
        vto[k].width = 0;
        vto[k].precision = 0;
      }
      if(flags & FLAGS_PRECPARAM) {
        /* we have the precision specified from a parameter, so we make that
           parameter's info setup properly */
        long k = precision - 1;
        if((k < 0) || (k >= MAX_PARAMETERS))
          /* out of allowed range */
          return 1;
        vto[i].precision = k;
        vto[k].type = FORMAT_WIDTH;
        vto[k].flags = FLAGS_NEW;
        /* can't use width or precision of width! */
        vto[k].width = 0;
        vto[k].precision = 0;
      }
      *endpos++ = fmt + ((*fmt == '\0') ? 0 : 1); /* end of this sequence */
    }
  }

  /* Read the arg list parameters into our data list */
  for(i = 0; i<max_param; i++) {
    /* Width/precision arguments must be read before the main argument
       they are attached to */
    if(vto[i].flags & FLAGS_WIDTHPARAM) {
      vto[vto[i].width].data.num.as_signed =
        (mp_intmax_t)va_arg(arglist, int);
    }
    if(vto[i].flags & FLAGS_PRECPARAM) {
      vto[vto[i].precision].data.num.as_signed =
        (mp_intmax_t)va_arg(arglist, int);
    }

    switch(vto[i].type) {
    case FORMAT_STRING:
      vto[i].data.str = va_arg(arglist, char *);
      break;

    case FORMAT_INTPTR:
    case FORMAT_UNKNOWN:
    case FORMAT_PTR:
      vto[i].data.ptr = va_arg(arglist, void *);
      break;

    case FORMAT_INT:
#ifdef HAVE_LONG_LONG_TYPE
      if((vto[i].flags & FLAGS_LONGLONG) && (vto[i].flags & FLAGS_UNSIGNED))
        vto[i].data.num.as_unsigned =
          (mp_uintmax_t)va_arg(arglist, mp_uintmax_t);
      else if(vto[i].flags & FLAGS_LONGLONG)
        vto[i].data.num.as_signed =
          (mp_intmax_t)va_arg(arglist, mp_intmax_t);
      else
#endif
      {
        if((vto[i].flags & FLAGS_LONG) && (vto[i].flags & FLAGS_UNSIGNED))
          vto[i].data.num.as_unsigned =
            (mp_uintmax_t)va_arg(arglist, unsigned long);
        else if(vto[i].flags & FLAGS_LONG)
          vto[i].data.num.as_signed =
            (mp_intmax_t)va_arg(arglist, long);
        else if(vto[i].flags & FLAGS_UNSIGNED)
          vto[i].data.num.as_unsigned =
            (mp_uintmax_t)va_arg(arglist, unsigned int);
        else
          vto[i].data.num.as_signed =
            (mp_intmax_t)va_arg(arglist, int);
      }
      break;

    case FORMAT_DOUBLE:
      vto[i].data.dnum = va_arg(arglist, double);
      break;

    case FORMAT_WIDTH:
      /* Argument has been read. Silently convert it into an integer
       * for later use
       */
      vto[i].type = FORMAT_INT;
      break;

    default:
      break;
    }
  }

  return 0;

}